

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O3

int mg_session_write_map(mg_session *session,mg_map *map)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = mg_session_write_container_size(session,map->size,MG_MARKERS_MAP);
  if (iVar1 == 0) {
    if (map->size != 0) {
      uVar2 = 0;
      do {
        iVar1 = mg_session_write_string2(session,map->keys[uVar2]->size,map->keys[uVar2]->data);
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = mg_session_write_value(session,map->values[uVar2]);
        if (iVar1 != 0) {
          return iVar1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < map->size);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mg_session_write_map(mg_session *session, const mg_map *map) {
  MG_RETURN_IF_FAILED(
      mg_session_write_container_size(session, map->size, MG_MARKERS_MAP));
  for (uint32_t i = 0; i < map->size; ++i) {
    MG_RETURN_IF_FAILED(mg_session_write_string2(session, map->keys[i]->size,
                                                 map->keys[i]->data));
    MG_RETURN_IF_FAILED(mg_session_write_value(session, map->values[i]));
  }
  return 0;
}